

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::ExportModuleField::~ExportModuleField(ExportModuleField *this)

{
  pointer pcVar1;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ExportModuleField_01544888;
  Var::~Var(&(this->export_).var);
  pcVar1 = (this->export_).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->export_).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

explicit ExportModuleField(const Location& loc = Location())
      : ModuleFieldMixin<ModuleFieldType::Export>(loc) {}